

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  pointer *ppuVar1;
  pointer *pppFVar2;
  uint *puVar3;
  byte *pbVar4;
  iterator __position;
  int iVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  Face *pFVar9;
  Model *pMVar10;
  Logger *pLVar11;
  byte *pbVar12;
  runtime_error *this_00;
  int iVar13;
  Material *pMVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  iterator iVar18;
  IndexArray *this_01;
  Mesh *pMVar19;
  uint uVar20;
  byte *pbVar21;
  ulong uVar22;
  Face *face;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  IndexArray *local_60;
  IndexArray *local_58;
  IndexArray *local_50;
  Face *local_48;
  pointer local_40;
  pointer local_38;
  
  pbVar21 = (byte *)(this->m_DataIt)._M_current;
  pbVar4 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar12 = pbVar4 + -1;
  if (pbVar12 != pbVar21 && pbVar21 != pbVar4) {
    do {
      if (((ulong)*pbVar21 < 0x21) && ((0x100003601U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))
      goto LAB_0044ec0b;
      pbVar21 = pbVar21 + 1;
    } while ((pbVar21 != pbVar4) && (pbVar21 != pbVar12));
  }
LAB_0044ec1a:
  (this->m_DataIt)._M_current = (char *)pbVar21;
  if ((pbVar21 != pbVar4) && (*pbVar21 != 0)) {
    pFVar9 = (Face *)operator_new(0x58);
    pFVar9->m_PrimitiveType = type;
    local_50 = &pFVar9->m_vertices;
    (pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pFVar9->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar9->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar9->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pFVar9->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar9->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar9->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar9->m_pMaterial = (Material *)0x0;
    pMVar10 = (this->m_pModel)._M_t.
              super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
              .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    local_68 = (int)((ulong)((long)*(pointer *)
                                    ((long)&(pMVar10->m_Vertices).
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    + 8) -
                            *(long *)&(pMVar10->m_Vertices).
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl) >> 2) * -0x55555555;
    local_38 = *(pointer *)
                ((long)&(pMVar10->m_TextureCoord).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> +
                8);
    local_40 = *(pointer *)
                &(pMVar10->m_TextureCoord).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl;
    local_6c = (int)((ulong)((long)local_38 - (long)local_40) >> 2) * -0x55555555;
    uVar15 = (long)*(pointer *)
                    ((long)&(pMVar10->m_Normals).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                    + 8) -
             *(long *)&(pMVar10->m_Normals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl;
    local_70 = (int)(uVar15 >> 2) * -0x55555555;
    local_64 = (uVar15 != 0) + 1;
    local_58 = &pFVar9->m_normals;
    local_60 = &pFVar9->m_texturCoords;
    bVar6 = 0;
    iVar16 = 0;
    local_48 = pFVar9;
    do {
      uVar15 = (ulong)*pbVar21;
      if (uVar15 < 0x30) {
        uVar22 = 1;
        if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
          if (uVar15 != 0x2f) {
            if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_0044ed64;
            break;
          }
          if (type == aiPrimitiveType_POINT) {
            pLVar11 = DefaultLogger::get();
            Logger::error(pLVar11,"Obj: Separator unexpected in point statement");
          }
          iVar17 = iVar16 + 1;
        }
        else {
          iVar17 = 0;
        }
      }
      else {
LAB_0044ed64:
        iVar7 = atoi((char *)pbVar21);
        uVar20 = -(iVar7 >> 0x1f);
        iVar13 = iVar7;
        for (iVar17 = iVar7; uVar20 = uVar20 + 1, 0x12 < iVar17 + 9U; iVar17 = iVar17 - iVar5) {
          iVar5 = iVar13 >> 0x1f;
          iVar17 = iVar13 / 10 + iVar5;
          iVar13 = iVar17 - iVar5;
        }
        iVar17 = local_64;
        if (iVar16 != 1) {
          iVar17 = iVar16;
        }
        if (local_40 != local_38) {
          iVar17 = iVar16;
        }
        if (iVar7 < 1) {
          if (-1 < iVar7) {
            ObjFile::Face::~Face(pFVar9);
            operator_delete(pFVar9);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,"OBJ: Invalid face indice","");
            std::runtime_error::runtime_error(this_00,(string *)local_90);
            *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (iVar17 == 2) {
            uVar8 = iVar7 + local_70;
            goto LAB_0044ee53;
          }
          if (iVar17 == 1) {
            uVar8 = iVar7 + local_6c;
            goto LAB_0044ee27;
          }
          if (iVar17 == 0) {
            uVar8 = iVar7 + local_68;
            goto LAB_0044edf3;
          }
LAB_0044ee0a:
          reportErrorTokenInFace(this);
        }
        else if (iVar17 == 2) {
          uVar8 = iVar7 - 1;
LAB_0044ee53:
          local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,uVar8);
          iVar18._M_current =
               (pFVar9->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar18._M_current ==
              (pFVar9->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_58,iVar18,(uint *)local_90);
          }
          else {
            *iVar18._M_current = uVar8;
            ppuVar1 = &(pFVar9->m_normals).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          bVar6 = 1;
        }
        else {
          if (iVar17 == 1) {
            uVar8 = iVar7 - 1;
LAB_0044ee27:
            local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,uVar8);
            iVar18._M_current =
                 (pFVar9->m_texturCoords).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            this_01 = local_60;
            if (iVar18._M_current !=
                (pFVar9->m_texturCoords).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar18._M_current = uVar8;
              ppuVar1 = &(pFVar9->m_texturCoords).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
              goto LAB_0044ee7e;
            }
          }
          else {
            if (iVar17 != 0) goto LAB_0044ee0a;
            uVar8 = iVar7 - 1;
LAB_0044edf3:
            local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,uVar8);
            iVar18._M_current =
                 (pFVar9->m_vertices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            this_01 = local_50;
            if (iVar18._M_current !=
                (pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *iVar18._M_current = uVar8;
              ppuVar1 = &(pFVar9->m_vertices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
              goto LAB_0044ee7e;
            }
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_01,iVar18,(uint *)local_90);
        }
LAB_0044ee7e:
        uVar22 = (ulong)uVar20;
      }
      pbVar21 = (byte *)((this->m_DataIt)._M_current + uVar22);
      (this->m_DataIt)._M_current = (char *)pbVar21;
      iVar16 = iVar17;
    } while (pbVar21 != (byte *)(this->m_DataItEnd)._M_current);
    if ((pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (pFVar9->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"Obj: Ignoring empty face");
      pFVar9 = local_48;
      pbVar12 = (byte *)(this->m_DataIt)._M_current;
      pbVar21 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar21 + -1 != pbVar12 && pbVar12 != pbVar21) {
        do {
          if (((*pbVar12 < 0xe) && ((0x3401U >> (*pbVar12 & 0x1f) & 1) != 0)) ||
             (pbVar12 = pbVar12 + 1, pbVar12 == pbVar21)) break;
        } while (pbVar12 != pbVar21 + -1);
      }
      pbVar4 = pbVar12;
      if (pbVar12 != pbVar21) {
        pbVar12 = pbVar12 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar4 = pbVar12;
      }
      for (; (pbVar4 != pbVar21 && ((*pbVar4 == 0x20 || (pbVar12 = pbVar4, *pbVar4 == 9))));
          pbVar4 = pbVar4 + 1) {
        pbVar12 = pbVar21;
      }
      (this->m_DataIt)._M_current = (char *)pbVar12;
      if (local_48 != (Face *)0x0) {
        ObjFile::Face::~Face(local_48);
      }
      operator_delete(pFVar9);
    }
    else {
      pMVar10 = (this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar14 = pMVar10->m_pCurrentMaterial;
      if (pMVar14 == (Material *)0x0) {
        pMVar14 = pMVar10->m_pDefaultMaterial;
      }
      pFVar9->m_pMaterial = pMVar14;
      if (pMVar10->m_pCurrent == (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar10 = (this->m_pModel)._M_t.
                  super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                  .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      }
      pMVar19 = pMVar10->m_pCurrentMesh;
      if (pMVar19 == (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar19 = ((this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                  m_pCurrentMesh;
      }
      __position._M_current =
           *(pointer *)
            ((long)&(pMVar19->m_Faces).
                    super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                    ._M_impl + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pMVar19->m_Faces).
                   super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                   ._M_impl + 0x10)) {
        std::vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>>::
        _M_realloc_insert<Assimp::ObjFile::Face*const&>
                  ((vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>> *)
                   &pMVar19->m_Faces,__position,&local_48);
      }
      else {
        *__position._M_current = pFVar9;
        pppFVar2 = (pointer *)
                   ((long)&(pMVar19->m_Faces).
                           super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                           ._M_impl + 8);
        *pppFVar2 = *pppFVar2 + 1;
        local_48 = pFVar9;
      }
      puVar3 = &((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh->m_uiNumIndices;
      *puVar3 = *puVar3 + (int)((ulong)((long)(local_48->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_48->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar3 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh->m_uiUVCoordinates;
      *puVar3 = *puVar3 + (int)((ulong)((long)(local_48->m_texturCoords).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_48->m_texturCoords).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      pMVar19 = ((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh;
      if (((~bVar6 | pMVar19->m_hasNormals) & 1) == 0) {
        pMVar19->m_hasNormals = true;
      }
      pbVar12 = (byte *)(this->m_DataIt)._M_current;
      pbVar21 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar21 + -1 != pbVar12 && pbVar12 != pbVar21) {
        while ((0xd < *pbVar12 || ((0x3401U >> (*pbVar12 & 0x1f) & 1) == 0))) {
          pbVar12 = pbVar12 + 1;
          if ((pbVar12 == pbVar21) || (pbVar12 == pbVar21 + -1)) break;
        }
      }
      pbVar4 = pbVar12;
      if (pbVar12 != pbVar21) {
        pbVar12 = pbVar12 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar4 = pbVar12;
      }
      for (; (pbVar4 != pbVar21 && ((*pbVar4 == 0x20 || (pbVar12 = pbVar4, *pbVar4 == 9))));
          pbVar4 = pbVar4 + 1) {
        pbVar12 = pbVar21;
      }
      (this->m_DataIt)._M_current = (char *)pbVar12;
    }
  }
  return;
LAB_0044ec0b:
  if ((*pbVar21 != 0x20) && (*pbVar21 != 9)) goto LAB_0044ec1a;
  pbVar21 = pbVar21 + 1;
  if ((pbVar21 == pbVar4) || (pbVar21 == pbVar12)) goto LAB_0044ec1a;
  goto LAB_0044ec0b;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}